

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O2

void __thiscall flatbuffers::ts::TsGenerator::generateEntry(TsGenerator *this)

{
  _Rb_tree_header *p_Var1;
  IdlNamer *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last;
  long lVar2;
  long lVar3;
  size_type sVar4;
  mapped_type *this_01;
  char *pcVar5;
  StructDef *pSVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  int local_274;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts_file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> base_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rel_components;
  string import_extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ts_file_path_rel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> type_name;
  string root;
  NsDefinition nsDef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string fully_qualified_type_name;
  string base_name_rel;
  
  code._M_dataplus._M_p = (pointer)&code.field_2;
  code._M_string_length = 0;
  root._M_dataplus._M_p = (pointer)&root.field_2;
  root._M_string_length = 0;
  code.field_2._M_local_buf[0] = '\0';
  root.field_2._M_local_buf[0] = '\0';
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
          ::count(&this->ns_defs_,&root);
  if (sVar4 == 0) {
    nsDef.path._M_dataplus._M_p = (pointer)&nsDef.path.field_2;
    nsDef.path._M_string_length = 0;
    nsDef.path.field_2._M_local_buf[0] = '\0';
    nsDef.filepath._M_dataplus._M_p = (pointer)&nsDef.filepath.field_2;
    nsDef.filepath._M_string_length = 0;
    nsDef.filepath.field_2._M_local_buf[0] = '\0';
    nsDef.symbolic_name._M_dataplus._M_p = (pointer)&nsDef.symbolic_name.field_2;
    nsDef.symbolic_name._M_string_length = 0;
    nsDef.symbolic_name.field_2._M_local_buf[0] = '\0';
    nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_header;
    nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         nsDef.definitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_assign((string *)&nsDef);
    std::__cxx11::string::_M_assign((string *)&nsDef.symbolic_name);
    std::operator+(&ts_file_path,(this->super_BaseGenerator).path_,
                   (this->super_BaseGenerator).file_name_);
    std::operator+(&base_name,&ts_file_path,".ts");
    std::__cxx11::string::operator=((string *)&nsDef.filepath,(string *)&base_name);
    std::__cxx11::string::~string((string *)&base_name);
    std::__cxx11::string::~string((string *)&ts_file_path);
    nsDef.ns = (Namespace *)operator_new(0x20);
    ((nsDef.ns)->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (nsDef.ns)->from_table = 0;
    ((nsDef.ns)->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((nsDef.ns)->components).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::(anonymous_namespace)::NsDefinition>_>_>
              ::operator[](&this->ns_defs_,&nsDef.path);
    anon_unknown_10::NsDefinition::operator=(this_01,&nsDef);
    anon_unknown_10::NsDefinition::~NsDefinition(&nsDef);
  }
  p_Var1 = &(this->ns_defs_)._M_t._M_impl.super__Rb_tree_header;
  this_00 = &this->namer_;
  for (p_Var9 = (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var1;
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
    pcVar5 = BaseGenerator::FlatBuffersGeneratedWarning();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&base_name_rel,pcVar5,(allocator<char> *)&ts_file_path_rel);
    std::operator+(&ts_file_path,"// ",&base_name_rel);
    std::operator+(&base_name,&ts_file_path,"\n\n");
    std::operator+(&nsDef.path,&base_name,
                   "/* eslint-disable @typescript-eslint/no-unused-vars, @typescript-eslint/no-explicit-any, @typescript-eslint/no-non-null-assertion */\n\n"
                  );
    std::__cxx11::string::operator=((string *)&code,(string *)&nsDef);
    std::__cxx11::string::~string((string *)&nsDef);
    std::__cxx11::string::~string((string *)&base_name);
    std::__cxx11::string::~string((string *)&ts_file_path);
    std::__cxx11::string::~string((string *)&base_name_rel);
    p_Var7 = *(_Rb_tree_node_base **)(p_Var9 + 6);
    local_274 = 0;
    for (; p_Var7 != (_Rb_tree_node_base *)&p_Var9[5]._M_left;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      rel_components.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      rel_components.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      rel_components.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __first = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                **(undefined8 **)(p_Var9 + 5);
      __last = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(undefined8 **)(p_Var9 + 5))[1];
      if ((ulong)((long)__last - (long)__first) < 0x21) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (__first,__last,&rel_components);
      }
      else {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (__first + 1,__last,&rel_components);
      }
      (*(this_00->super_Namer)._vptr_Namer[0xc])(&nsDef,this_00,*(undefined8 *)(p_Var7 + 2),3);
      Namer::Directories(&ts_file_path,&this_00->super_Namer,
                         *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           **)(p_Var9 + 5),OutputPath,kUpperCamel);
      std::operator+(&base_name,&ts_file_path,&nsDef.path);
      std::__cxx11::string::~string((string *)&ts_file_path);
      std::operator+(&ts_file_path,&base_name,".ts");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&base_name_rel,"./",(allocator<char> *)&ts_file_path_rel);
      Namer::Directories(&ts_file_path_rel,&this_00->super_Namer,&rel_components,OutputPath,
                         kUpperCamel);
      std::__cxx11::string::append((string *)&base_name_rel);
      std::__cxx11::string::~string((string *)&ts_file_path_rel);
      std::__cxx11::string::append((string *)&base_name_rel);
      std::operator+(&ts_file_path_rel,&base_name_rel,".ts");
      std::__cxx11::string::string((string *)&type_name,(string *)(p_Var7 + 1));
      Namespace::GetFullyQualifiedName
                (&fully_qualified_type_name,*(Namespace **)(p_Var9 + 5),&type_name,1000);
      pSVar6 = SymbolTable<flatbuffers::StructDef>::Lookup
                         (&((this->super_BaseGenerator).parser_)->structs_,
                          &fully_qualified_type_name);
      std::operator+(&import_extension,"export { ",&type_name);
      std::__cxx11::string::append((string *)&code);
      std::__cxx11::string::~string((string *)&import_extension);
      if ((pSVar6 != (StructDef *)0x0) &&
         ((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api != false)) {
        std::operator+(&local_1a8,", ",&type_name);
        std::operator+(&import_extension,&local_1a8,
                       &(((this->super_BaseGenerator).parser_)->opts).object_suffix);
        std::__cxx11::string::append((string *)&code);
        std::__cxx11::string::~string((string *)&import_extension);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::append((char *)&code);
      pcVar5 = ".js";
      if ((((this->super_BaseGenerator).parser_)->opts).ts_no_import_ext != false) {
        pcVar5 = "";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&import_extension,pcVar5,(allocator<char> *)&local_1a8);
      std::operator+(&local_90,&base_name_rel,&import_extension);
      std::operator+(&local_1a8,&local_90,"\';\n");
      std::__cxx11::string::append((string *)&code);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_90);
      local_274 = local_274 + 1;
      std::__cxx11::string::~string((string *)&import_extension);
      std::__cxx11::string::~string((string *)&fully_qualified_type_name);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::~string((string *)&ts_file_path_rel);
      std::__cxx11::string::~string((string *)&base_name_rel);
      std::__cxx11::string::~string((string *)&ts_file_path);
      std::__cxx11::string::~string((string *)&base_name);
      std::__cxx11::string::~string((string *)&nsDef);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&rel_components);
    }
    lVar2 = (*(long **)(p_Var9 + 5))[1];
    lVar3 = **(long **)(p_Var9 + 5);
    for (p_Var8 = (this->ns_defs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      if ((*(long **)(p_Var8 + 5))[1] - **(long **)(p_Var8 + 5) >> 5 == (lVar2 - lVar3 >> 5) + 1) {
        std::operator+(&nsDef.path,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 2),".ts");
        std::operator+(&ts_file_path,"export * as ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var8 + 4));
        std::operator+(&base_name,&ts_file_path," from \'./");
        std::__cxx11::string::append((string *)&code);
        std::__cxx11::string::~string((string *)&base_name);
        std::__cxx11::string::~string((string *)&ts_file_path);
        std::__cxx11::string::string((string *)&base_name,(string *)(p_Var8 + 2));
        std::operator+(&ts_file_path,&base_name,".js\';\n");
        std::__cxx11::string::append((string *)&code);
        std::__cxx11::string::~string((string *)&ts_file_path);
        local_274 = local_274 + 1;
        std::__cxx11::string::~string((string *)&base_name);
        std::__cxx11::string::~string((string *)&nsDef);
      }
    }
    if (0 < local_274) {
      SaveFile(*(char **)(p_Var9 + 3),&code,false);
    }
  }
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::~string((string *)&code);
  return;
}

Assistant:

void generateEntry() {
    std::string code;

    // add root namespace def if not already existing from defs tracking
    std::string root;
    if (ns_defs_.count(root) == 0) {
      NsDefinition nsDef;
      nsDef.path = root;
      nsDef.symbolic_name = file_name_;
      nsDef.filepath = path_ + file_name_ + ".ts";
      nsDef.ns = new Namespace();
      ns_defs_[nsDef.path] = nsDef;
    }

    for (const auto &it : ns_defs_) {
      code = "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n" +
        "/* eslint-disable @typescript-eslint/no-unused-vars, @typescript-eslint/no-explicit-any, @typescript-eslint/no-non-null-assertion */\n\n";
      
      // export all definitions in ns entry point module
      int export_counter = 0;
      for (const auto &def : it.second.definitions) {
        std::vector<std::string> rel_components;
        // build path for root level vs child level
        if (it.second.ns->components.size() > 1)
          std::copy(it.second.ns->components.begin() + 1,
                    it.second.ns->components.end(),
                    std::back_inserter(rel_components));
        else
          std::copy(it.second.ns->components.begin(),
                    it.second.ns->components.end(),
                    std::back_inserter(rel_components));
        auto base_file_name =
            namer_.File(*(def.second), SkipFile::SuffixAndExtension);
        auto base_name =
            namer_.Directories(it.second.ns->components, SkipDir::OutputPath) +
            base_file_name;
        auto ts_file_path = base_name + ".ts";
        auto base_name_rel = std::string("./");
        base_name_rel +=
            namer_.Directories(rel_components, SkipDir::OutputPath);
        base_name_rel += base_file_name;
        auto ts_file_path_rel = base_name_rel + ".ts";
        auto type_name = def.first;
        auto fully_qualified_type_name =
            it.second.ns->GetFullyQualifiedName(type_name);
        auto is_struct = parser_.structs_.Lookup(fully_qualified_type_name);
        code += "export { " + type_name;
        if (parser_.opts.generate_object_based_api && is_struct) {
          code += ", " + type_name + parser_.opts.object_suffix;
        }
        code += " } from '";
        std::string import_extension =
            parser_.opts.ts_no_import_ext ? "" : ".js";
        code += base_name_rel + import_extension + "';\n";
        export_counter++;
      }

      // re-export child namespace(s) in parent
      const auto child_ns_level = it.second.ns->components.size() + 1;
      for (const auto &it2 : ns_defs_) {
        if (it2.second.ns->components.size() != child_ns_level) continue;
        auto ts_file_path = it2.second.path + ".ts";
        code += "export * as " + it2.second.symbolic_name + " from './";
        std::string rel_path = it2.second.path;
        code += rel_path + ".js';\n";
        export_counter++;
      }

      if (export_counter > 0) SaveFile(it.second.filepath.c_str(), code, false);
    }
  }